

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlbinary.c
# Opt level: O1

err_t EBML_BinarySetData(ebml_binary *Element,uint8_t *Data,size_t DataSize)

{
  bool_t bVar1;
  err_t eVar2;
  
  bVar1 = ArrayResize(&Element->Data,DataSize,0);
  if (bVar1 == 0) {
    eVar2 = -2;
  }
  else {
    memcpy((Element->Data)._Begin,Data,DataSize);
    (Element->Base).DataSize = DataSize;
    (Element->Base).bValueIsSet = '\x01';
    (Element->Base).bNeedDataSizeUpdate = '\0';
    eVar2 = 0;
  }
  return eVar2;
}

Assistant:

META_END(EBML_ELEMENT_CLASS)

err_t EBML_BinarySetData(ebml_binary *Element, const uint8_t *Data, size_t DataSize)
{
    if (!ArrayResize(&Element->Data,DataSize,0))
        return ERR_OUT_OF_MEMORY;
    memcpy(ARRAYBEGIN(Element->Data,void),Data,DataSize);
    Element->Base.DataSize = DataSize;
    Element->Base.bNeedDataSizeUpdate = 0;
    Element->Base.bValueIsSet = 1;
    return ERR_NONE;
}